

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_quality(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_HISTOGRAM ref_histogram;
  REF_GRID ref_grid_local;
  
  ref_histogram = (REF_HISTOGRAM)ref_grid;
  uVar1 = ref_histogram_create((REF_HISTOGRAM *)&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    uVar1 = ref_histogram_add_quality(_ref_private_macro_code_rss_1,(REF_GRID)ref_histogram);
    if (uVar1 == 0) {
      if ((*(int *)((long)ref_histogram->max + 4) == 0) &&
         (ref_grid_local._4_4_ =
               ref_histogram_print(_ref_private_macro_code_rss_1,(REF_GRID)ref_histogram,"quality"),
         ref_grid_local._4_4_ != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x203,"ref_histogram_quality",(ulong)ref_grid_local._4_4_,"print");
      }
      else {
        ref_grid_local._4_4_ = ref_histogram_free(_ref_private_macro_code_rss_1);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
                 ,0x205,"ref_histogram_quality",(ulong)ref_grid_local._4_4_,"free gram");
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x200,"ref_histogram_quality",(ulong)uVar1,"add quality");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x1fe,"ref_histogram_quality",(ulong)uVar1,"create");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_quality(REF_GRID ref_grid) {
  REF_HISTOGRAM ref_histogram;

  RSS(ref_histogram_create(&ref_histogram), "create");

  RSS(ref_histogram_add_quality(ref_histogram, ref_grid), "add quality");

  if (ref_grid_once(ref_grid))
    RSS(ref_histogram_print(ref_histogram, ref_grid, "quality"), "print");

  RSS(ref_histogram_free(ref_histogram), "free gram");
  return REF_SUCCESS;
}